

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.cpp
# Opt level: O0

void moveBits(uint8_t *buffer,int oldBitOffset,int newBitOffset,int len)

{
  uint uVar1;
  uint value;
  undefined1 local_70 [4];
  int c;
  BitStreamWriter writer;
  uint8_t *dst;
  BitStreamReader reader;
  uint8_t *src;
  int len_local;
  int newBitOffset_local;
  int oldBitOffset_local;
  uint8_t *buffer_local;
  
  reader._24_8_ = buffer + (oldBitOffset >> 3);
  BitStreamReader::BitStreamReader((BitStreamReader *)&dst);
  BitStreamReader::setBuffer
            ((BitStreamReader *)&dst,(uint8_t *)reader._24_8_,
             (uint8_t *)(reader._24_8_ + (long)(len / 8) + 1));
  writer._24_8_ = buffer + (newBitOffset >> 3);
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_70);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)local_70,(uint8_t *)writer._24_8_,
             (uint8_t *)(writer._24_8_ + (long)(len / 8) + 1));
  BitStreamWriter::skipBits((BitStreamWriter *)local_70,newBitOffset % 8);
  src._4_4_ = len;
  if (oldBitOffset % 8 != 0) {
    BitStreamReader::skipBits((BitStreamReader *)&dst,oldBitOffset % 8);
    uVar1 = 8 - oldBitOffset % 8;
    value = BitStreamReader::getBits((BitStreamReader *)&dst,uVar1);
    BitStreamWriter::putBits((BitStreamWriter *)local_70,uVar1,value);
    src._4_4_ = len - uVar1;
    reader._24_8_ = reader._24_8_ + 1;
  }
  for (; 7 < (int)src._4_4_ && (reader._24_8_ & 3) != 0; src._4_4_ = src._4_4_ - 8) {
    BitStreamWriter::putBits((BitStreamWriter *)local_70,8,(uint)*(byte *)reader._24_8_);
    reader._24_8_ = reader._24_8_ + 1;
  }
  for (; 0x1f < (int)src._4_4_; src._4_4_ = src._4_4_ - 0x20) {
    BitStreamWriter::putBits((BitStreamWriter *)local_70,0x20,*(uint *)reader._24_8_);
    reader._24_8_ = reader._24_8_ + 4;
  }
  BitStreamReader::setBuffer
            ((BitStreamReader *)&dst,(uint8_t *)reader._24_8_,(uint8_t *)(reader._24_8_ + 4));
  uVar1 = BitStreamReader::getBits((BitStreamReader *)&dst,src._4_4_);
  BitStreamWriter::putBits((BitStreamWriter *)local_70,src._4_4_,uVar1);
  BitStreamWriter::flushBits((BitStreamWriter *)local_70);
  return;
}

Assistant:

void moveBits(uint8_t* buffer, const int oldBitOffset, const int newBitOffset, int len)
{
    uint8_t* src = buffer + (oldBitOffset >> 3);
    BitStreamReader reader{};
    reader.setBuffer(src, src + len / 8 + 1);
    uint8_t* dst = buffer + (newBitOffset >> 3);
    BitStreamWriter writer{};
    writer.setBuffer(dst, dst + len / 8 + 1);
    writer.skipBits(newBitOffset % 8);
    if (oldBitOffset % 8)
    {
        reader.skipBits(oldBitOffset % 8);
        const int c = 8 - (oldBitOffset % 8);
        writer.putBits(c, reader.getBits(c));
        len -= c;
        src++;
    }
    for (; len >= 8 && (reinterpret_cast<std::uintptr_t>(src) % sizeof(unsigned)) != 0; len -= 8)
    {
        writer.putBits(8, *src);
        src++;
    }

    for (; len >= static_cast<int>(INT_BIT); len -= INT_BIT)
    {
        writer.putBits(INT_BIT, *reinterpret_cast<unsigned*>(src));
        src += sizeof(unsigned);
    }
    reader.setBuffer(src, src + sizeof(unsigned));
    writer.putBits(len, reader.getBits(len));
    writer.flushBits();
}